

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution_test_util.cc
# Opt level: O3

ostream * absl::lts_20240722::random_internal::operator<<(ostream *os,DistributionMoments *moments)

{
  ostream *poVar1;
  long *local_70;
  long local_68;
  long local_60 [2];
  double local_50;
  code *local_48;
  double local_40;
  code *local_38;
  double local_30;
  code *local_28;
  double local_20;
  code *local_18;
  
  local_40 = moments->variance;
  if (local_40 < 0.0) {
    local_40 = sqrt(local_40);
  }
  else {
    local_40 = SQRT(local_40);
  }
  local_50 = moments->mean;
  local_48 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  local_38 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  local_30 = moments->skewness;
  local_28 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  local_20 = moments->kurtosis;
  local_18 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
            (&local_70,"mean=%f, stddev=%f, skewness=%f, kurtosis=%f",0x2c,&local_50,4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const DistributionMoments& moments) {
  return os << absl::StrFormat("mean=%f, stddev=%f, skewness=%f, kurtosis=%f",
                               moments.mean, std::sqrt(moments.variance),
                               moments.skewness, moments.kurtosis);
}